

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeNativePtr
          (string *__return_storage_ptr__,CppGenerator *this,string *type,FieldDef *field,
          bool is_constructor)

{
  bool bVar1;
  string *__lhs;
  string *__lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __lhs = PtrType_abi_cxx11_(this,field);
  bVar1 = std::operator!=(__lhs,"naked");
  if (bVar1) {
    bVar1 = std::operator!=(__lhs,"default_ptr_type");
    __lhs_00 = &(this->opts_).super_IDLOptions.cpp_object_api_pointer_type;
    if (bVar1) {
      __lhs_00 = __lhs;
    }
    std::operator+(&local_48,__lhs_00,"<");
    std::operator+(&bStack_68,&local_48,type);
    std::operator+(__return_storage_ptr__,&bStack_68,">");
    std::__cxx11::string::~string((string *)&bStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else if (is_constructor) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&bStack_68);
  }
  else {
    std::operator+(__return_storage_ptr__,type," *");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeNativePtr(const std::string &type, const FieldDef *field,
                               bool is_constructor) {
    auto &ptr_type = PtrType(field);
    if (ptr_type != "naked") {
      return (ptr_type != "default_ptr_type"
                  ? ptr_type
                  : opts_.cpp_object_api_pointer_type) +
             "<" + type + ">";
    } else if (is_constructor) {
      return "";
    } else {
      return type + " *";
    }
  }